

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  undefined4 in_EDX;
  long in_RDI;
  AppendFile *this_00;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<MutexLock,_std::default_delete<MutexLock>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined4 *)(in_RDI + 0x20) = in_EDX;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  operator_new(0x28);
  MutexLock::MutexLock((MutexLock *)0x10c8b5);
  std::unique_ptr<MutexLock,std::default_delete<MutexLock>>::
  unique_ptr<std::default_delete<MutexLock>,void>
            (in_stack_ffffffffffffffa0,(pointer)in_stack_ffffffffffffff98);
  this_00 = (AppendFile *)(in_RDI + 0x30);
  std::unique_ptr<AppendFile,std::default_delete<AppendFile>>::
  unique_ptr<std::default_delete<AppendFile>,void>
            ((unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *)this_00);
  operator_new(0x10008);
  AppendFile::AppendFile(this_00,(string *)in_stack_ffffffffffffff98);
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::reset
            ((unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *)this_00,
             in_stack_ffffffffffffff98);
  return;
}

Assistant:

LogFile::LogFile(const string& basename, int flushEveryN)
        :basename_(basename),
        flushEveryN_(flushEveryN),
        count_(0),
        mutex_(new MutexLock()) {
            file_.reset(new AppendFile(basename));
}